

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

uint16_t __thiscall helics::CommonCore::getNextAirlockIndex(CommonCore *this)

{
  ushort uVar1;
  ushort uVar2;
  ushort *puVar3;
  long in_RDI;
  uint16_t exp;
  uint16_t index;
  memory_order in_stack_ffffffffffffff44;
  ushort local_44;
  ushort local_42;
  undefined4 local_38;
  ushort local_32;
  ushort *local_30;
  ushort *local_28;
  bool local_1f;
  ushort local_1e;
  memory_order local_1c;
  undefined4 local_18;
  ushort local_12;
  ushort *local_10;
  ushort *local_8;
  
  local_42 = std::__atomic_base<unsigned_short>::operator++
                       ((__atomic_base<unsigned_short> *)(in_RDI + 0xafc),0);
  if (3 < local_42) {
    local_42 = local_42 % 4;
  }
  if (local_42 == 3) {
    local_44 = 4;
    do {
      if (local_44 < 4) {
        return local_42;
      }
      puVar3 = (ushort *)(in_RDI + 0xafc);
      uVar1 = local_44 & 3;
      local_38 = 5;
      local_32 = uVar1;
      local_30 = &local_44;
      local_28 = puVar3;
      local_1c = CLI::std::__cmpexch_failure_order(in_stack_ffffffffffffff44);
      local_18 = 5;
      switch(0x541323) {
      default:
        if (local_1c - consume < 2) {
          LOCK();
          uVar2 = *puVar3;
          local_1f = local_44 == uVar2;
          if (local_1f) {
            *puVar3 = uVar1;
            uVar2 = local_44;
          }
          UNLOCK();
          if (!local_1f) {
            local_44 = uVar2;
          }
        }
        else if (local_1c == seq_cst) {
          LOCK();
          uVar2 = *puVar3;
          local_1f = local_44 == uVar2;
          if (local_1f) {
            *puVar3 = uVar1;
            uVar2 = local_44;
          }
          UNLOCK();
          if (!local_1f) {
            local_44 = uVar2;
          }
        }
        else {
          LOCK();
          uVar2 = *puVar3;
          local_1f = local_44 == uVar2;
          if (local_1f) {
            *puVar3 = uVar1;
            uVar2 = local_44;
          }
          UNLOCK();
          if (!local_1f) {
            local_44 = uVar2;
          }
        }
        break;
      case 2:
        if (local_1c - consume < 2) {
          LOCK();
          uVar2 = *puVar3;
          local_1f = local_44 == uVar2;
          if (local_1f) {
            *puVar3 = uVar1;
            uVar2 = local_44;
          }
          UNLOCK();
          if (!local_1f) {
            local_44 = uVar2;
          }
        }
        else if (local_1c == seq_cst) {
          LOCK();
          uVar2 = *puVar3;
          local_1f = local_44 == uVar2;
          if (local_1f) {
            *puVar3 = uVar1;
            uVar2 = local_44;
          }
          UNLOCK();
          if (!local_1f) {
            local_44 = uVar2;
          }
        }
        else {
          LOCK();
          uVar2 = *puVar3;
          local_1f = local_44 == uVar2;
          if (local_1f) {
            *puVar3 = uVar1;
            uVar2 = local_44;
          }
          UNLOCK();
          if (!local_1f) {
            local_44 = uVar2;
          }
        }
        break;
      case 3:
        if (local_1c - consume < 2) {
          LOCK();
          uVar2 = *puVar3;
          local_1f = local_44 == uVar2;
          if (local_1f) {
            *puVar3 = uVar1;
            uVar2 = local_44;
          }
          UNLOCK();
          if (!local_1f) {
            local_44 = uVar2;
          }
        }
        else if (local_1c == seq_cst) {
          LOCK();
          uVar2 = *puVar3;
          local_1f = local_44 == uVar2;
          if (local_1f) {
            *puVar3 = uVar1;
            uVar2 = local_44;
          }
          UNLOCK();
          if (!local_1f) {
            local_44 = uVar2;
          }
        }
        else {
          LOCK();
          uVar2 = *puVar3;
          local_1f = local_44 == uVar2;
          if (local_1f) {
            *puVar3 = uVar1;
            uVar2 = local_44;
          }
          UNLOCK();
          if (!local_1f) {
            local_44 = uVar2;
          }
        }
        break;
      case 4:
        if (local_1c - consume < 2) {
          LOCK();
          uVar2 = *puVar3;
          local_1f = local_44 == uVar2;
          if (local_1f) {
            *puVar3 = uVar1;
            uVar2 = local_44;
          }
          UNLOCK();
          if (!local_1f) {
            local_44 = uVar2;
          }
        }
        else if (local_1c == seq_cst) {
          LOCK();
          uVar2 = *puVar3;
          local_1f = local_44 == uVar2;
          if (local_1f) {
            *puVar3 = uVar1;
            uVar2 = local_44;
          }
          UNLOCK();
          if (!local_1f) {
            local_44 = uVar2;
          }
        }
        else {
          LOCK();
          uVar2 = *puVar3;
          local_1f = local_44 == uVar2;
          if (local_1f) {
            *puVar3 = uVar1;
            uVar2 = local_44;
          }
          UNLOCK();
          in_stack_ffffffffffffff44 =
               CONCAT22(uVar2,CONCAT11(local_1f,(char)in_stack_ffffffffffffff44));
          if (!local_1f) {
            local_44 = uVar2;
          }
        }
      }
      local_1e = uVar1;
      local_12 = uVar1;
      local_10 = &local_44;
      local_8 = puVar3;
    } while (local_1f == false);
  }
  return local_42;
}

Assistant:

uint16_t CommonCore::getNextAirlockIndex()
{
    uint16_t index = nextAirLock++;
    if (index > 3) {  // the increment is an atomic operation if the nextAirLock was not adjusted
                      // this could result in an out of
        // bounds exception if this check were not done
        index %= 4;
    }
    if (index == 3) {
        decltype(index) exp = 4;

        while (exp > 3) {  // doing a lock free modulus we need to make sure the nextAirLock<4
            if (nextAirLock.compare_exchange_weak(exp, exp % 4)) {
                break;
            }
        }
    }
    return index;
}